

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QPolygonF * __thiscall
QGraphicsView::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsView *this,QRect *rect)

{
  QGraphicsViewPrivate *this_00;
  double dVar1;
  QPointF *b;
  QPointF *pQVar2;
  pointer pQVar3;
  long lVar4;
  qreal *pqVar5;
  qint64 qVar6;
  long in_FS_OFFSET;
  byte bVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  QArrayData *d;
  QPointF local_78 [5];
  long local_28;
  
  bVar7 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x2).m_i < (rect->x1).m_i) || ((rect->y2).m_i < (rect->y1).m_i)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0062e79e;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  }
  else {
    this_00 = *(QGraphicsViewPrivate **)(this + 8);
    if ((this_00->field_0x300 & 0x20) == 0) {
      qVar6 = this_00->scrollX;
    }
    else {
      QGraphicsViewPrivate::updateScroll(this_00);
      qVar6 = this_00->scrollX;
      if ((this_00->field_0x300 & 0x20) != 0) {
        QGraphicsViewPrivate::updateScroll(this_00);
      }
    }
    qVar8 = (qreal)this_00->scrollY;
    dVar11 = (double)(rect->x1).m_i + (double)qVar6;
    dVar12 = (double)(rect->y1).m_i + qVar8;
    dVar13 = (double)((rect->x2).m_i + 1) + (double)qVar6;
    dVar1 = (double)((rect->y2).m_i + 1) + qVar8;
    local_78[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QPointF *)QArrayData::allocate((QArrayData **)local_78,0x10,0x10,4,KeepSize);
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)local_78[0].xp;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = pQVar2;
    pQVar2[3].xp = 0.0;
    pQVar2[3].yp = 0.0;
    pQVar2[2].xp = 0.0;
    pQVar2[2].yp = 0.0;
    pQVar2[1].xp = 0.0;
    pQVar2[1].yp = 0.0;
    pQVar2->xp = 0.0;
    pQVar2->yp = 0.0;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = 4;
    if ((this_00->field_0x300 & 0x10) == 0) {
      pqVar5 = (qreal *)&DAT_006f5c10;
      pQVar2 = local_78;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar2->xp = *pqVar5;
        pqVar5 = pqVar5 + (ulong)bVar7 * -2 + 1;
        pQVar2 = (QPointF *)&pQVar2[-(ulong)bVar7].yp;
      }
      QTransform::inverted((bool *)local_78);
      qVar10 = (qreal)QTransform::map(local_78);
      qVar9 = qVar8;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3->xp = qVar10;
      pQVar3->yp = qVar8;
      qVar8 = (qreal)QTransform::map(local_78);
      qVar10 = qVar9;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[1].xp = qVar8;
      pQVar3[1].yp = qVar9;
      qVar8 = (qreal)QTransform::map(local_78);
      qVar9 = qVar10;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[2].xp = qVar8;
      pQVar3[2].yp = qVar10;
      qVar8 = (qreal)QTransform::map(local_78);
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[3].xp = qVar8;
      pQVar3[3].yp = qVar9;
    }
    else {
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3->xp = dVar11;
      pQVar3->yp = dVar12;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[1].xp = dVar13;
      pQVar3[1].yp = dVar12;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[2].xp = dVar13;
      pQVar3[2].yp = dVar1;
      pQVar3 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar3[3].xp = dVar11;
      pQVar3[3].yp = dVar1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0062e79e:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QRect &rect) const
{
    Q_D(const QGraphicsView);
    if (!rect.isValid())
        return QPolygonF();

    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    QRect r = rect.adjusted(0, 0, 1, 1);
    QPointF tl = scrollOffset + r.topLeft();
    QPointF tr = scrollOffset + r.topRight();
    QPointF br = scrollOffset + r.bottomRight();
    QPointF bl = scrollOffset + r.bottomLeft();

    QPolygonF poly(4);
    if (!d->identityMatrix) {
        QTransform x = d->matrix.inverted();
        poly[0] = x.map(tl);
        poly[1] = x.map(tr);
        poly[2] = x.map(br);
        poly[3] = x.map(bl);
    } else {
        poly[0] = tl;
        poly[1] = tr;
        poly[2] = br;
        poly[3] = bl;
    }
    return poly;
}